

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>>,true>::type,ranges::detail::variant_visitor<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>::advance_fwd_fun,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (long n,indexed_element<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_0UL>
                      self)

{
  cursor<true> *fun;
  long in_stack_00000010;
  long in_stack_00000018;
  advance_fwd_fun local_20;
  long local_10;
  
  if (n == 0) {
    local_20.pos = fun;
    local_20.n = in_stack_00000010;
    local_10 = in_stack_00000018;
    concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
    ::cursor<true>::advance_fwd_fun::
    operator()<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_0UL,_true,_0>
              (&local_20,self);
    if (*(long *)(local_10 + 8) != -1) {
      *(undefined8 *)(local_10 + 8) = 0xffffffffffffffff;
    }
    *(undefined8 *)(local_10 + 8) = 0;
  }
  else {
    (self.t_)->_M_current = (self.t_)->_M_current + in_stack_00000010;
    if (*(long *)(in_stack_00000018 + 8) != -1) {
      *(undefined8 *)(in_stack_00000018 + 8) = 0xffffffffffffffff;
    }
    *(undefined8 *)(in_stack_00000018 + 8) = 1;
  }
  return 0;
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }